

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void leveldb::AppendInternalKey(string *result,ParsedInternalKey *key)

{
  string *dst;
  Slice *in_RSI;
  char *in_RDI;
  
  dst = (string *)Slice::data(in_RSI);
  Slice::size(in_RSI);
  std::__cxx11::string::append(in_RDI,(ulong)dst);
  PackSequenceAndType((uint64_t)in_RSI[1].data_,(ValueType)in_RSI[1].size_);
  PutFixed64(dst,(uint64_t)in_RDI);
  return;
}

Assistant:

void AppendInternalKey(std::string* result, const ParsedInternalKey& key) {
  result->append(key.user_key.data(), key.user_key.size());
  PutFixed64(result, PackSequenceAndType(key.sequence, key.type));
}